

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# convolution_sgemm_pack1to4_int8.h
# Opt level: O3

void ncnn::im2col_sgemm_pack1to4_int8_sse(Mat *bottom_im2col,Mat *top_blob,Mat *kernel,Option *opt)

{
  uint uVar1;
  uint uVar2;
  undefined1 auVar3 [16];
  undefined1 auVar4 [16];
  undefined1 auVar5 [16];
  undefined1 auVar6 [16];
  undefined1 auVar7 [16];
  undefined1 auVar8 [16];
  undefined1 auVar9 [16];
  undefined1 auVar10 [16];
  undefined1 auVar11 [16];
  int *piVar12;
  int iVar13;
  ulong uVar14;
  uint uVar15;
  long lVar16;
  undefined1 *puVar17;
  uint _h;
  long lVar18;
  long lVar19;
  undefined1 (*pauVar20) [16];
  ulong uVar21;
  ulong uVar22;
  uint uVar23;
  size_t _elemsize;
  undefined1 *puVar24;
  ulong *puVar25;
  long lVar26;
  ulong uVar27;
  undefined1 (*pauVar28) [16];
  int iVar29;
  long lVar30;
  long lVar31;
  long lVar32;
  int iVar33;
  undefined1 auVar34 [16];
  undefined1 auVar35 [16];
  undefined1 auVar36 [64];
  undefined1 auVar37 [64];
  undefined1 auVar38 [64];
  undefined1 auVar39 [64];
  undefined1 auVar40 [64];
  undefined1 auVar41 [64];
  undefined1 local_d8 [16];
  undefined1 local_a8 [64];
  size_t local_68;
  undefined1 local_58 [16];
  ulong local_48;
  Mat *local_40;
  ulong local_38;
  
  local_58._8_8_ = local_58._0_8_;
  iVar13 = cpu_support_x86_avx2();
  if (iVar13 != 0) {
    im2col_sgemm_pack1to4_int8_sse_avx2(bottom_im2col,top_blob,kernel,opt);
    return;
  }
  iVar13 = cpu_support_x86_xop();
  if (iVar13 == 0) {
    uVar1 = bottom_im2col->w;
    iVar13 = bottom_im2col->h;
    uVar23 = bottom_im2col->c;
    lVar19 = (long)(int)uVar23;
    uVar2 = top_blob->c;
    local_68 = 0;
    local_a8._0_8_ = (void *)0x0;
    local_a8._8_4_ = 0;
    local_a8._12_4_ = 0;
    local_a8._16_8_ = 0;
    local_a8._24_4_ = 0;
    local_a8._32_8_ = (Allocator *)0x0;
    local_a8._40_4_ = 0;
    local_a8._44_4_ = 0;
    local_a8._48_12_ = SUB1612((undefined1  [16])0x0,4);
    iVar33 = iVar13;
    uVar15 = uVar1;
    if (lVar19 < 4) {
      iVar29 = 1;
      _elemsize = 1;
      _h = uVar23;
      if (1 < (int)uVar1) {
        iVar33 = iVar13 * 2;
        uVar15 = (uVar1 & 1) + (uVar1 >> 1);
        iVar29 = 1;
      }
    }
    else if ((int)uVar1 < 2) {
      iVar29 = 4;
      _elemsize = 4;
      _h = (uVar23 & 3) + (uVar23 >> 2);
    }
    else {
      _elemsize = 4;
      iVar33 = iVar13 * 2;
      _h = (uVar23 & 3) + (uVar23 >> 2);
      uVar15 = (uVar1 & 1) + (uVar1 >> 1);
      iVar29 = 4;
    }
    local_40 = top_blob;
    Mat::create((Mat *)local_a8,iVar33,_h,uVar15,_elemsize,iVar29,opt->workspace_allocator);
    uVar14 = (ulong)(int)uVar1;
    local_58._0_8_ = bottom_im2col;
    if (0 < (int)uVar1 >> 1) {
      local_48 = (ulong)(uint)((int)uVar1 >> 1);
      lVar32 = 1;
      uVar27 = 0;
      do {
        local_38 = uVar27;
        puVar24 = (undefined1 *)(local_68 * local_38 * local_a8._16_8_ + local_a8._0_8_);
        if ((int)uVar23 < 4) {
          uVar27 = 0;
        }
        else {
          lVar26 = 3;
          lVar30 = 1;
          lVar31 = 2;
          uVar21 = 0;
          do {
            if (0 < iVar13) {
              lVar18 = bottom_im2col->cstep * bottom_im2col->elemsize;
              lVar16 = (long)bottom_im2col->data + lVar32;
              iVar33 = iVar13;
              do {
                *puVar24 = *(undefined1 *)(lVar16 + -1 + lVar18 * uVar21);
                puVar24[1] = *(undefined1 *)(lVar16 + -1 + lVar18 * lVar30);
                puVar24[2] = *(undefined1 *)(lVar16 + -1 + lVar18 * lVar31);
                puVar24[3] = *(undefined1 *)(lVar16 + -1 + lVar18 * lVar26);
                puVar24[4] = *(undefined1 *)(lVar16 + lVar18 * uVar21);
                puVar24[5] = *(undefined1 *)(lVar16 + lVar18 * lVar30);
                puVar24[6] = *(undefined1 *)(lVar16 + lVar18 * lVar31);
                puVar24[7] = *(undefined1 *)(lVar16 + lVar18 * lVar26);
                puVar24 = puVar24 + 8;
                lVar16 = lVar16 + (ulong)uVar1;
                iVar33 = iVar33 + -1;
              } while (iVar33 != 0);
            }
            uVar27 = uVar21 + 4;
            lVar16 = uVar21 + 7;
            lVar26 = lVar26 + 4;
            lVar30 = lVar30 + 4;
            lVar31 = lVar31 + 4;
            uVar21 = uVar27;
          } while (lVar16 < lVar19);
        }
        if ((int)uVar27 < (int)uVar23) {
          uVar27 = uVar27 & 0xffffffff;
          do {
            if (0 < iVar13) {
              lVar26 = bottom_im2col->cstep * bottom_im2col->elemsize * uVar27;
              lVar30 = (long)bottom_im2col->data + lVar32;
              iVar33 = iVar13;
              do {
                *puVar24 = *(undefined1 *)(lVar30 + -1 + lVar26);
                puVar24[1] = *(undefined1 *)(lVar30 + lVar26);
                puVar24 = puVar24 + 2;
                lVar30 = lVar30 + (ulong)uVar1;
                iVar33 = iVar33 + -1;
              } while (iVar33 != 0);
            }
            uVar27 = uVar27 + 1;
          } while (uVar27 != uVar23);
        }
        lVar32 = lVar32 + 2;
        uVar27 = local_38 + 1;
      } while (local_38 + 1 != local_48);
    }
    uVar27 = uVar14 & 0xfffffffffffffffe;
    if ((uint)uVar27 != uVar1) {
      do {
        uVar15 = ((uint)(uVar27 >> 0x1f) & 1) + (int)uVar27;
        puVar24 = (undefined1 *)
                  ((long)(int)(((int)uVar15 >> 1) + ((int)uVar27 - (uVar15 & 0xfffffffe))) *
                   local_68 * local_a8._16_8_ + local_a8._0_8_);
        if ((int)uVar23 < 4) {
          uVar21 = 0;
        }
        else {
          lVar32 = 1;
          lVar26 = 2;
          lVar30 = 3;
          uVar22 = 0;
          do {
            if (0 < iVar13) {
              lVar31 = bottom_im2col->cstep * bottom_im2col->elemsize;
              lVar16 = (long)bottom_im2col->data + uVar27;
              iVar33 = iVar13;
              do {
                *puVar24 = *(undefined1 *)(lVar16 + lVar31 * uVar22);
                puVar24[1] = *(undefined1 *)(lVar16 + lVar31 * lVar32);
                puVar24[2] = *(undefined1 *)(lVar16 + lVar31 * lVar26);
                puVar24[3] = *(undefined1 *)(lVar16 + lVar31 * lVar30);
                puVar24 = puVar24 + 4;
                lVar16 = lVar16 + uVar14;
                iVar33 = iVar33 + -1;
              } while (iVar33 != 0);
            }
            uVar21 = uVar22 + 4;
            lVar31 = uVar22 + 7;
            lVar32 = lVar32 + 4;
            lVar26 = lVar26 + 4;
            lVar30 = lVar30 + 4;
            uVar22 = uVar21;
          } while (lVar31 < lVar19);
        }
        if ((int)uVar21 < (int)uVar23) {
          uVar21 = uVar21 & 0xffffffff;
          do {
            if (0 < iVar13) {
              puVar17 = (undefined1 *)
                        ((long)bottom_im2col->data +
                        uVar27 + bottom_im2col->cstep * uVar21 * bottom_im2col->elemsize);
              iVar33 = iVar13;
              do {
                *puVar24 = *puVar17;
                puVar24 = puVar24 + 1;
                puVar17 = puVar17 + uVar14;
                iVar33 = iVar33 + -1;
              } while (iVar33 != 0);
            }
            uVar21 = uVar21 + 1;
          } while (uVar21 != uVar23);
        }
        uVar27 = uVar27 + 1;
      } while ((long)uVar27 < (long)uVar14);
    }
    if (0 < (int)uVar2) {
      uVar15 = uVar23 + 3;
      if (-1 < (int)uVar23) {
        uVar15 = uVar23;
      }
      iVar33 = ((int)uVar15 >> 2) * iVar13;
      iVar13 = ((int)uVar23 % 4) * iVar13;
      uVar27 = 0;
      do {
        pauVar20 = (undefined1 (*) [16])
                   (local_40->cstep * uVar27 * local_40->elemsize + (long)local_40->data);
        if ((int)uVar1 < 2) {
          uVar21 = 0;
        }
        else {
          uVar22 = 0;
          do {
            puVar25 = (ulong *)((uVar22 >> 1) * local_68 * local_a8._16_8_ + local_a8._0_8_);
            pauVar28 = (undefined1 (*) [16])
                       (kernel->cstep * uVar27 * kernel->elemsize + (long)kernel->data);
            if (iVar33 < 1) {
              auVar37 = ZEXT1664((undefined1  [16])0x0);
              auVar36 = ZEXT1664((undefined1  [16])0x0);
            }
            else {
              local_d8 = (undefined1  [16])0x0;
              auVar41 = ZEXT1664((undefined1  [16])0x0);
              auVar37 = ZEXT1664((undefined1  [16])0x0);
              auVar38 = ZEXT1664((undefined1  [16])0x0);
              auVar40 = ZEXT1664((undefined1  [16])0x0);
              auVar36 = ZEXT1664((undefined1  [16])0x0);
              auVar39 = ZEXT1664((undefined1  [16])0x0);
              auVar34 = ZEXT816(0) << 0x40;
              iVar29 = iVar33;
              do {
                local_58 = auVar34;
                auVar34._8_8_ = 0;
                auVar34._0_8_ = *puVar25;
                auVar3 = vpmovsxbw_avx(auVar34);
                auVar34 = *pauVar28;
                auVar35 = vpcmpgtb_avx((undefined1  [16])0x0,auVar34);
                auVar9 = vpunpcklbw_avx(auVar34,auVar35);
                auVar8 = vpunpckhbw_avx(auVar34,auVar35);
                auVar7 = vpshufd_avx(auVar3,0x44);
                auVar35 = vpmullw_avx(auVar7,auVar9);
                auVar34 = vpmulhw_avx(auVar7,auVar9);
                auVar4 = vpmullw_avx(auVar7,auVar8);
                auVar7 = vpmulhw_avx(auVar7,auVar8);
                auVar3 = vpshufd_avx(auVar3,0xee);
                auVar5 = vpmullw_avx(auVar3,auVar9);
                auVar9 = vpmulhw_avx(auVar3,auVar9);
                auVar6 = vpmullw_avx(auVar3,auVar8);
                auVar8 = vpmulhw_avx(auVar3,auVar8);
                auVar3 = vpunpcklwd_avx(auVar35,auVar34);
                local_d8 = vpaddd_avx(auVar3,local_d8);
                auVar34 = vpunpckhwd_avx(auVar35,auVar34);
                auVar35 = vpaddd_avx(auVar34,auVar37._0_16_);
                auVar37 = ZEXT1664(auVar35);
                auVar34 = vpunpcklwd_avx(auVar4,auVar7);
                auVar3 = vpaddd_avx(auVar34,auVar38._0_16_);
                auVar38 = ZEXT1664(auVar3);
                auVar34 = vpunpckhwd_avx(auVar4,auVar7);
                auVar7 = vpaddd_avx(auVar40._0_16_,auVar34);
                auVar40 = ZEXT1664(auVar7);
                auVar34 = vpunpcklwd_avx(auVar5,auVar9);
                auVar4 = vpaddd_avx(auVar34,auVar41._0_16_);
                auVar41 = ZEXT1664(auVar4);
                auVar34 = vpunpckhwd_avx(auVar5,auVar9);
                auVar34 = vpaddd_avx(local_58,auVar34);
                auVar9 = vpunpcklwd_avx(auVar6,auVar8);
                auVar9 = vpaddd_avx(auVar36._0_16_,auVar9);
                auVar36 = ZEXT1664(auVar9);
                auVar8 = vpunpckhwd_avx(auVar6,auVar8);
                auVar8 = vpaddd_avx(auVar39._0_16_,auVar8);
                auVar39 = ZEXT1664(auVar8);
                puVar25 = puVar25 + 1;
                pauVar28 = pauVar28 + 1;
                iVar29 = iVar29 + -1;
              } while (iVar29 != 0);
              auVar5 = vpunpckldq_avx(local_d8,auVar35);
              auVar6 = vpunpckldq_avx(auVar3,auVar7);
              auVar35 = vpunpckhdq_avx(local_d8,auVar35);
              auVar3 = vpunpckhdq_avx(auVar3,auVar7);
              auVar10 = vpunpckldq_avx(auVar4,auVar34);
              auVar11 = vpunpckldq_avx(auVar9,auVar8);
              auVar7 = vpunpckhdq_avx(auVar4,auVar34);
              auVar4 = vpunpckhdq_avx(auVar9,auVar8);
              auVar9 = vpunpcklqdq_avx(auVar5,auVar6);
              auVar34 = vpunpckhqdq_avx(auVar5,auVar6);
              auVar34 = vpaddd_avx(auVar9,auVar34);
              auVar9 = vpunpcklqdq_avx(auVar35,auVar3);
              auVar35 = vpunpckhqdq_avx(auVar35,auVar3);
              auVar35 = vpaddd_avx(auVar35,auVar9);
              auVar34 = vpaddd_avx(auVar34,auVar35);
              auVar36 = ZEXT1664(auVar34);
              auVar35 = vpunpcklqdq_avx(auVar10,auVar11);
              auVar34 = vpunpckhqdq_avx(auVar10,auVar11);
              auVar34 = vpaddd_avx(auVar35,auVar34);
              auVar3 = vpunpcklqdq_avx(auVar7,auVar4);
              auVar35 = vpunpckhqdq_avx(auVar7,auVar4);
              auVar35 = vpaddd_avx(auVar35,auVar3);
              auVar34 = vpaddd_avx(auVar34,auVar35);
              auVar37 = ZEXT1664(auVar34);
            }
            auVar35 = auVar37._0_16_;
            auVar34 = auVar36._0_16_;
            if (0 < iVar13) {
              lVar19 = 0;
              do {
                auVar34 = vpmovsxbw_avx(ZEXT216(*(ushort *)((long)puVar25 + lVar19 * 2)));
                auVar34 = vpshuflw_avx(auVar34,0x50);
                auVar7 = vpshufd_avx(auVar34,0x50);
                auVar35._8_8_ = 0;
                auVar35._0_8_ = *(ulong *)(*pauVar28 + lVar19 * 4);
                auVar34 = vpmovsxbw_avx(auVar35);
                auVar34 = vpshufd_avx(auVar34,0x44);
                auVar3 = vpmullw_avx(auVar7,auVar34);
                auVar35 = vpmulhw_avx(auVar7,auVar34);
                auVar34 = vpunpcklwd_avx(auVar3,auVar35);
                auVar34 = vpaddd_avx(auVar36._0_16_,auVar34);
                auVar36 = ZEXT1664(auVar34);
                auVar35 = vpunpckhwd_avx(auVar3,auVar35);
                auVar35 = vpaddd_avx(auVar37._0_16_,auVar35);
                auVar37 = ZEXT1664(auVar35);
                lVar19 = lVar19 + 1;
              } while (iVar13 != (int)lVar19);
            }
            *pauVar20 = auVar34;
            pauVar20[1] = auVar35;
            pauVar20 = pauVar20 + 2;
            uVar21 = uVar22 + 2;
            lVar19 = uVar22 + 3;
            uVar22 = uVar21;
          } while (lVar19 < (long)uVar14);
        }
        if ((int)uVar21 < (int)uVar1) {
          do {
            puVar25 = (ulong *)((((uint)uVar21 & 1) + ((uint)(uVar21 >> 1) & 0x7fffffff)) * local_68
                                * local_a8._16_8_ + local_a8._0_8_);
            pauVar28 = (undefined1 (*) [16])
                       (kernel->cstep * uVar27 * kernel->elemsize + (long)kernel->data);
            auVar36 = ZEXT1664((undefined1  [16])0x0);
            if (0 < iVar33) {
              auVar37 = ZEXT1664((undefined1  [16])0x0);
              auVar38 = ZEXT1664((undefined1  [16])0x0);
              auVar39 = ZEXT1664((undefined1  [16])0x0);
              iVar29 = iVar33;
              do {
                auVar3._8_8_ = 0;
                auVar3._0_8_ = *puVar25;
                auVar3 = vpmovsxbw_avx(auVar3);
                auVar34 = *pauVar28;
                auVar35 = vpcmpgtb_avx((undefined1  [16])0x0,auVar34);
                auVar4 = vpunpcklbw_avx(auVar34,auVar35);
                auVar7 = vpunpckhbw_avx(auVar34,auVar35);
                auVar34 = vpshufd_avx(auVar3,0x44);
                auVar3 = vpmullw_avx(auVar34,auVar4);
                auVar35 = vpmulhw_avx(auVar34,auVar4);
                auVar4 = vpmullw_avx(auVar34,auVar7);
                auVar7 = vpmulhw_avx(auVar34,auVar7);
                auVar34 = vpunpcklwd_avx(auVar3,auVar35);
                auVar34 = vpaddd_avx(auVar39._0_16_,auVar34);
                auVar39 = ZEXT1664(auVar34);
                auVar35 = vpunpckhwd_avx(auVar3,auVar35);
                auVar35 = vpaddd_avx(auVar38._0_16_,auVar35);
                auVar38 = ZEXT1664(auVar35);
                auVar3 = vpunpcklwd_avx(auVar4,auVar7);
                auVar3 = vpaddd_avx(auVar37._0_16_,auVar3);
                auVar37 = ZEXT1664(auVar3);
                auVar7 = vpunpckhwd_avx(auVar4,auVar7);
                auVar7 = vpaddd_avx(auVar36._0_16_,auVar7);
                auVar36 = ZEXT1664(auVar7);
                puVar25 = (ulong *)((long)puVar25 + 4);
                pauVar28 = pauVar28 + 1;
                iVar29 = iVar29 + -1;
              } while (iVar29 != 0);
              auVar4 = vpunpckldq_avx(auVar34,auVar35);
              auVar9 = vpunpckldq_avx(auVar3,auVar7);
              auVar35 = vpunpckhdq_avx(auVar34,auVar35);
              auVar3 = vpunpckhdq_avx(auVar3,auVar7);
              auVar7 = vpunpcklqdq_avx(auVar4,auVar9);
              auVar34 = vpunpckhqdq_avx(auVar4,auVar9);
              auVar34 = vpaddd_avx(auVar7,auVar34);
              auVar7 = vpunpcklqdq_avx(auVar35,auVar3);
              auVar35 = vpunpckhqdq_avx(auVar35,auVar3);
              auVar35 = vpaddd_avx(auVar35,auVar7);
              auVar34 = vpaddd_avx(auVar34,auVar35);
              auVar36 = ZEXT1664(auVar34);
            }
            auVar34 = auVar36._0_16_;
            if (0 < iVar13) {
              lVar19 = 0;
              do {
                auVar34 = vpshuflw_avx(ZEXT416((uint)(int)*(char *)((long)puVar25 + lVar19)),0);
                auVar3 = vpshufd_avx(auVar34,0);
                auVar7._8_8_ = 0;
                auVar7._0_8_ = *(ulong *)(*pauVar28 + lVar19 * 4);
                auVar34 = vpmovsxbw_avx(auVar7);
                auVar35 = vpmullw_avx(auVar3,auVar34);
                auVar34 = vpmulhw_avx(auVar3,auVar34);
                auVar34 = vpunpcklwd_avx(auVar35,auVar34);
                auVar34 = vpaddd_avx(auVar36._0_16_,auVar34);
                auVar36 = ZEXT1664(auVar34);
                lVar19 = lVar19 + 1;
              } while (iVar13 != (int)lVar19);
            }
            *pauVar20 = auVar34;
            pauVar20 = pauVar20 + 1;
            uVar23 = (uint)uVar21 + 1;
            uVar21 = (ulong)uVar23;
          } while (uVar23 != uVar1);
        }
        uVar27 = uVar27 + 1;
      } while (uVar27 != uVar2);
    }
    piVar12 = (int *)CONCAT44(local_a8._12_4_,local_a8._8_4_);
    if (piVar12 != (int *)0x0) {
      LOCK();
      *piVar12 = *piVar12 + -1;
      UNLOCK();
      if (*piVar12 == 0) {
        if ((Allocator *)local_a8._32_8_ == (Allocator *)0x0) {
          if ((void *)local_a8._0_8_ != (void *)0x0) {
            free((void *)local_a8._0_8_);
          }
        }
        else {
          (*(*(_func_int ***)local_a8._32_8_)[3])();
        }
      }
    }
    return;
  }
  im2col_sgemm_pack1to4_int8_sse_xop(bottom_im2col,top_blob,kernel,opt);
  return;
}

Assistant:

static void im2col_sgemm_pack1to4_int8_sse(const Mat& bottom_im2col, Mat& top_blob, const Mat& kernel, const Option& opt)
{
#if !(__AVX512VNNI__ || __AVXVNNI__ || __AVX2__ || __XOP__)
#if NCNN_RUNTIME_CPU && NCNN_AVX512VNNI && __AVX512F__ && !__AVX512VNNI__
    if (ncnn::cpu_support_x86_avx512_vnni())
    {
        im2col_sgemm_pack1to4_int8_sse_avx512vnni(bottom_im2col, top_blob, kernel, opt);
        return;
    }
#endif

#if NCNN_RUNTIME_CPU && NCNN_AVXVNNI && __AVX2__ && !__AVXVNNI__
    if (ncnn::cpu_support_x86_avx_vnni())
    {
        im2col_sgemm_pack1to4_int8_sse_avxvnni(bottom_im2col, top_blob, kernel, opt);
        return;
    }
#endif

#if NCNN_RUNTIME_CPU && NCNN_AVX2 && __AVX__ && !__AVX2__
    if (ncnn::cpu_support_x86_avx2())
    {
        im2col_sgemm_pack1to4_int8_sse_avx2(bottom_im2col, top_blob, kernel, opt);
        return;
    }
#endif

#if NCNN_RUNTIME_CPU && NCNN_XOP && __SSE2__ && !__XOP__
    if (ncnn::cpu_support_x86_xop())
    {
        im2col_sgemm_pack1to4_int8_sse_xop(bottom_im2col, top_blob, kernel, opt);
        return;
    }
#endif
#endif

    // Mat bottom_im2col(size, maxk, inch, 8u, 8, opt.workspace_allocator);

    const int size = bottom_im2col.w;
    const int maxk = bottom_im2col.h;
    const int inch = bottom_im2col.c;

    const int outch = top_blob.c;

    // permute
    Mat tmp;
    if (inch >= 4)
    {
#if __AVX2__
        if (size >= 4)
            tmp.create(4 * maxk, inch / 4 + inch % 4, size / 4 + (size % 4) / 2 + size % 2, 4u, 4, opt.workspace_allocator);
        else if (size >= 2)
            tmp.create(2 * maxk, inch / 4 + inch % 4, size / 2 + size % 2, 4u, 4, opt.workspace_allocator);
        else
            tmp.create(maxk, inch / 4 + inch % 4, size, 4u, 4, opt.workspace_allocator);
#else
        if (size >= 2)
            tmp.create(2 * maxk, inch / 4 + inch % 4, size / 2 + size % 2, 4u, 4, opt.workspace_allocator);
        else
            tmp.create(maxk, inch / 4 + inch % 4, size, 4u, 4, opt.workspace_allocator);
#endif
    }
    else
    {
#if __AVX2__
        if (size >= 4)
            tmp.create(4 * maxk, inch, size / 4 + (size % 4) / 2 + size % 2, 1u, 1, opt.workspace_allocator);
        else if (size >= 2)
            tmp.create(2 * maxk, inch, size / 2 + size % 2, 1u, 1, opt.workspace_allocator);
        else
            tmp.create(maxk, inch, size, 1u, 1, opt.workspace_allocator);
#else
        if (size >= 2)
            tmp.create(2 * maxk, inch, size / 2 + size % 2, 1u, 1, opt.workspace_allocator);
        else
            tmp.create(maxk, inch, size, 1u, 1, opt.workspace_allocator);
#endif
    }
    {
#if __AVX2__
        int remain_size_start = 0;
        int nn_size = size >> 2;

        #pragma omp parallel for num_threads(opt.num_threads)
        for (int ii = 0; ii < nn_size; ii++)
        {
            int i = remain_size_start + ii * 4;

            signed char* tmpptr = tmp.channel(i / 4);

            int q = 0;
            for (; q + 3 < inch; q += 4)
            {
                const signed char* img0 = (const signed char*)bottom_im2col.channel(q) + i;
                const signed char* img1 = (const signed char*)bottom_im2col.channel(q + 1) + i;
                const signed char* img2 = (const signed char*)bottom_im2col.channel(q + 2) + i;
                const signed char* img3 = (const signed char*)bottom_im2col.channel(q + 3) + i;

                for (int k = 0; k < maxk; k++)
                {
                    tmpptr[0] = img0[0];
                    tmpptr[1] = img1[0];
                    tmpptr[2] = img2[0];
                    tmpptr[3] = img3[0];
                    tmpptr[4] = img0[1];
                    tmpptr[5] = img1[1];
                    tmpptr[6] = img2[1];
                    tmpptr[7] = img3[1];
                    tmpptr[8] = img0[2];
                    tmpptr[9] = img1[2];
                    tmpptr[10] = img2[2];
                    tmpptr[11] = img3[2];
                    tmpptr[12] = img0[3];
                    tmpptr[13] = img1[3];
                    tmpptr[14] = img2[3];
                    tmpptr[15] = img3[3];
                    tmpptr += 16;

                    img0 += size;
                    img1 += size;
                    img2 += size;
                    img3 += size;
                }
            }
            for (; q < inch; q++)
            {
                const signed char* img0 = (const signed char*)bottom_im2col.channel(q) + i;

                for (int k = 0; k < maxk; k++)
                {
                    tmpptr[0] = img0[0];
                    tmpptr[1] = img0[1];
                    tmpptr[2] = img0[2];
                    tmpptr[3] = img0[3];

                    tmpptr += 4;

                    img0 += size;
                }
            }
        }

        remain_size_start += nn_size << 2;
        nn_size = (size - remain_size_start) >> 1;
#else
        int remain_size_start = 0;
        int nn_size = (size - remain_size_start) >> 1;
#endif

        #pragma omp parallel for num_threads(opt.num_threads)
        for (int ii = 0; ii < nn_size; ii++)
        {
            int i = remain_size_start + ii * 2;

#if __AVX2__
            signed char* tmpptr = tmp.channel(i / 4 + (i % 4) / 2);
#else
            signed char* tmpptr = tmp.channel(i / 2);
#endif

            int q = 0;
            for (; q + 3 < inch; q += 4)
            {
                const signed char* img0 = (const signed char*)bottom_im2col.channel(q) + i;
                const signed char* img1 = (const signed char*)bottom_im2col.channel(q + 1) + i;
                const signed char* img2 = (const signed char*)bottom_im2col.channel(q + 2) + i;
                const signed char* img3 = (const signed char*)bottom_im2col.channel(q + 3) + i;

                for (int k = 0; k < maxk; k++)
                {
                    tmpptr[0] = img0[0];
                    tmpptr[1] = img1[0];
                    tmpptr[2] = img2[0];
                    tmpptr[3] = img3[0];
                    tmpptr[4] = img0[1];
                    tmpptr[5] = img1[1];
                    tmpptr[6] = img2[1];
                    tmpptr[7] = img3[1];
                    tmpptr += 8;

                    img0 += size;
                    img1 += size;
                    img2 += size;
                    img3 += size;
                }
            }
            for (; q < inch; q++)
            {
                const signed char* img0 = (const signed char*)bottom_im2col.channel(q) + i;

                for (int k = 0; k < maxk; k++)
                {
                    tmpptr[0] = img0[0];
                    tmpptr[1] = img0[1];

                    tmpptr += 2;

                    img0 += size;
                }
            }
        }

        remain_size_start += nn_size << 1;

        #pragma omp parallel for num_threads(opt.num_threads)
        for (int i = remain_size_start; i < size; i++)
        {
#if __AVX2__
            signed char* tmpptr = tmp.channel(i / 4 + (i % 4) / 2 + i % 2);
#else
            signed char* tmpptr = tmp.channel(i / 2 + i % 2);
#endif

            int q = 0;
            for (; q + 3 < inch; q += 4)
            {
                const signed char* img0 = (const signed char*)bottom_im2col.channel(q) + i;
                const signed char* img1 = (const signed char*)bottom_im2col.channel(q + 1) + i;
                const signed char* img2 = (const signed char*)bottom_im2col.channel(q + 2) + i;
                const signed char* img3 = (const signed char*)bottom_im2col.channel(q + 3) + i;

                for (int k = 0; k < maxk; k++)
                {
                    tmpptr[0] = img0[0];
                    tmpptr[1] = img1[0];
                    tmpptr[2] = img2[0];
                    tmpptr[3] = img3[0];
                    tmpptr += 4;

                    img0 += size;
                    img1 += size;
                    img2 += size;
                    img3 += size;
                }
            }
            for (; q < inch; q++)
            {
                const signed char* img0 = (const signed char*)bottom_im2col.channel(q) + i;

                for (int k = 0; k < maxk; k++)
                {
                    tmpptr[0] = img0[0];

                    tmpptr += 1;

                    img0 += size;
                }
            }
        }
    }

    #pragma omp parallel for num_threads(opt.num_threads)
    for (int p = 0; p < outch; p++)
    {
        int* outptr0 = top_blob.channel(p);

        int i = 0;
#if __AVX2__
        for (; i + 3 < size; i += 4)
        {
            const signed char* tmpptr = tmp.channel(i / 4);
            const signed char* kptr0 = kernel.channel(p);

            int nn4 = (inch / 4) * maxk;
            int nn1 = (inch % 4) * maxk;

            __m256i _sum00_12 = _mm256_setzero_si256();
            __m256i _sum20_32 = _mm256_setzero_si256();

            if (nn4 > 0)
            {
#if __AVXVNNI__ || __AVX512VNNI__
                __m256i _sum10_02 = _mm256_setzero_si256();
                __m256i _sum30_22 = _mm256_setzero_si256();
#else
                __m256i _sum10_02 = _mm256_setzero_si256();
                __m256i _sum01_13 = _mm256_setzero_si256();
                __m256i _sum11_03 = _mm256_setzero_si256();
                __m256i _sum30_22 = _mm256_setzero_si256();
                __m256i _sum21_33 = _mm256_setzero_si256();
                __m256i _sum31_23 = _mm256_setzero_si256();
#endif

                int j = 0;
                for (; j < nn4; j++)
                {
                    __m128i _val0123 = _mm_loadu_si128((const __m128i*)tmpptr);
                    __m256i _val0123_16 = _mm256_cvtepi8_epi16(_val0123);

                    __m256i _val01_16 = _mm256_permute4x64_epi64(_val0123_16, _MM_SHUFFLE(1, 1, 0, 0));
                    __m256i _val23_16 = _mm256_permute4x64_epi64(_val0123_16, _MM_SHUFFLE(3, 3, 2, 2));

                    __m128i _w01 = _mm_loadu_si128((const __m128i*)kptr0);
                    __m256i _w01_16 = _mm256_cvtepi8_epi16(_w01);

                    __m256i _val10_16 = _mm256_permute4x64_epi64(_val01_16, 78);
                    __m256i _val32_16 = _mm256_permute4x64_epi64(_val23_16, 78);

#if __AVXVNNI__ || __AVX512VNNI__
                    _sum00_12 = _mm256_dpwssd_epi32(_sum00_12, _val01_16, _w01_16);
                    _sum10_02 = _mm256_dpwssd_epi32(_sum10_02, _val10_16, _w01_16);
                    _sum20_32 = _mm256_dpwssd_epi32(_sum20_32, _val23_16, _w01_16);
                    _sum30_22 = _mm256_dpwssd_epi32(_sum30_22, _val32_16, _w01_16);
#else
                    __m256i _sl00_11 = _mm256_mullo_epi16(_val01_16, _w01_16);
                    __m256i _sh00_11 = _mm256_mulhi_epi16(_val01_16, _w01_16);
                    __m256i _sl10_01 = _mm256_mullo_epi16(_val10_16, _w01_16);
                    __m256i _sh10_01 = _mm256_mulhi_epi16(_val10_16, _w01_16);
                    __m256i _sl20_31 = _mm256_mullo_epi16(_val23_16, _w01_16);
                    __m256i _sh20_31 = _mm256_mulhi_epi16(_val23_16, _w01_16);
                    __m256i _sl30_21 = _mm256_mullo_epi16(_val32_16, _w01_16);
                    __m256i _sh30_21 = _mm256_mulhi_epi16(_val32_16, _w01_16);

                    _sum00_12 = _mm256_add_epi32(_sum00_12, _mm256_unpacklo_epi16(_sl00_11, _sh00_11));
                    _sum10_02 = _mm256_add_epi32(_sum10_02, _mm256_unpacklo_epi16(_sl10_01, _sh10_01));
                    _sum01_13 = _mm256_add_epi32(_sum01_13, _mm256_unpackhi_epi16(_sl00_11, _sh00_11));
                    _sum11_03 = _mm256_add_epi32(_sum11_03, _mm256_unpackhi_epi16(_sl10_01, _sh10_01));
                    _sum20_32 = _mm256_add_epi32(_sum20_32, _mm256_unpacklo_epi16(_sl20_31, _sh20_31));
                    _sum30_22 = _mm256_add_epi32(_sum30_22, _mm256_unpacklo_epi16(_sl30_21, _sh30_21));
                    _sum21_33 = _mm256_add_epi32(_sum21_33, _mm256_unpackhi_epi16(_sl20_31, _sh20_31));
                    _sum31_23 = _mm256_add_epi32(_sum31_23, _mm256_unpackhi_epi16(_sl30_21, _sh30_21));
#endif

                    tmpptr += 16;
                    kptr0 += 16;
                }

#if __AVXVNNI__ || __AVX512VNNI__
                _sum00_12 = _mm256_hadd_epi32(_sum00_12, _sum10_02);
                _sum20_32 = _mm256_hadd_epi32(_sum20_32, _sum30_22);

                _sum00_12 = _mm256_permute4x64_epi64(_sum00_12, _MM_SHUFFLE(2, 1, 3, 0));
                _sum20_32 = _mm256_permute4x64_epi64(_sum20_32, _MM_SHUFFLE(2, 1, 3, 0));
#else
                // transpose 4x8
                {
                    __m256i _tmp0, _tmp1, _tmp2, _tmp3;
                    _tmp0 = _mm256_unpacklo_epi32(_sum00_12, _sum10_02);
                    _tmp1 = _mm256_unpacklo_epi32(_sum01_13, _sum11_03);
                    _tmp2 = _mm256_unpackhi_epi32(_sum00_12, _sum10_02);
                    _tmp3 = _mm256_unpackhi_epi32(_sum01_13, _sum11_03);
                    _sum00_12 = _mm256_unpacklo_epi64(_tmp0, _tmp1);
                    _sum10_02 = _mm256_unpackhi_epi64(_tmp0, _tmp1);
                    _sum01_13 = _mm256_unpacklo_epi64(_tmp2, _tmp3);
                    _sum11_03 = _mm256_unpackhi_epi64(_tmp2, _tmp3);
                }
                {
                    __m256i _tmp0, _tmp1, _tmp2, _tmp3;
                    _tmp0 = _mm256_unpacklo_epi32(_sum20_32, _sum30_22);
                    _tmp1 = _mm256_unpacklo_epi32(_sum21_33, _sum31_23);
                    _tmp2 = _mm256_unpackhi_epi32(_sum20_32, _sum30_22);
                    _tmp3 = _mm256_unpackhi_epi32(_sum21_33, _sum31_23);
                    _sum20_32 = _mm256_unpacklo_epi64(_tmp0, _tmp1);
                    _sum30_22 = _mm256_unpackhi_epi64(_tmp0, _tmp1);
                    _sum21_33 = _mm256_unpacklo_epi64(_tmp2, _tmp3);
                    _sum31_23 = _mm256_unpackhi_epi64(_tmp2, _tmp3);
                }

                _sum00_12 = _mm256_add_epi32(_sum00_12, _sum10_02);
                _sum01_13 = _mm256_add_epi32(_sum01_13, _sum11_03);
                _sum00_12 = _mm256_add_epi32(_sum00_12, _sum01_13);

                _sum20_32 = _mm256_add_epi32(_sum20_32, _sum30_22);
                _sum21_33 = _mm256_add_epi32(_sum21_33, _sum31_23);
                _sum20_32 = _mm256_add_epi32(_sum20_32, _sum21_33);

                __m256i _perm_mask = _mm256_set_epi32(6, 4, 3, 1, 7, 5, 2, 0);
                _sum00_12 = _mm256_permutevar8x32_epi32(_sum00_12, _perm_mask);
                _sum20_32 = _mm256_permutevar8x32_epi32(_sum20_32, _perm_mask);
#endif
            }

            __m128i _sum00 = _mm256_extracti128_si256(_sum00_12, 0);
            __m128i _sum10 = _mm256_extracti128_si256(_sum00_12, 1);
            __m128i _sum20 = _mm256_extracti128_si256(_sum20_32, 0);
            __m128i _sum30 = _mm256_extracti128_si256(_sum20_32, 1);

            int j = 0;
            for (; j < nn1; j++)
            {
                __m128i _val01 = _mm_set_epi16(tmpptr[1], tmpptr[1], tmpptr[1], tmpptr[1], tmpptr[0], tmpptr[0], tmpptr[0], tmpptr[0]);
                __m128i _val23 = _mm_set_epi16(tmpptr[3], tmpptr[3], tmpptr[3], tmpptr[3], tmpptr[2], tmpptr[2], tmpptr[2], tmpptr[2]);

                __m128i _w0123 = _mm_set_epi16(kptr0[3], kptr0[2], kptr0[1], kptr0[0], kptr0[3], kptr0[2], kptr0[1], kptr0[0]);

                __m128i _sl00 = _mm_mullo_epi16(_val01, _w0123);
                __m128i _sh00 = _mm_mulhi_epi16(_val01, _w0123);
                __m128i _sl10 = _mm_mullo_epi16(_val23, _w0123);
                __m128i _sh10 = _mm_mulhi_epi16(_val23, _w0123);

                _sum00 = _mm_add_epi32(_sum00, _mm_unpacklo_epi16(_sl00, _sh00));
                _sum10 = _mm_add_epi32(_sum10, _mm_unpackhi_epi16(_sl00, _sh00));
                _sum20 = _mm_add_epi32(_sum20, _mm_unpacklo_epi16(_sl10, _sh10));
                _sum30 = _mm_add_epi32(_sum30, _mm_unpackhi_epi16(_sl10, _sh10));

                tmpptr += 4;
                kptr0 += 4;
            }

            _mm_storeu_si128((__m128i*)outptr0, _sum00);
            _mm_storeu_si128((__m128i*)(outptr0 + 4), _sum10);
            _mm_storeu_si128((__m128i*)(outptr0 + 8), _sum20);
            _mm_storeu_si128((__m128i*)(outptr0 + 12), _sum30);
            outptr0 += 16;
        }
#endif
        for (; i + 1 < size; i += 2)
        {
#if __AVX2__
            const signed char* tmpptr = tmp.channel(i / 4 + (i % 4) / 2);
#else
            const signed char* tmpptr = tmp.channel(i / 2);
#endif
            const signed char* kptr0 = kernel.channel(p);

            int nn4 = (inch / 4) * maxk;
            int nn1 = (inch % 4) * maxk;

#if __AVX2__
            __m256i _sum00_12 = _mm256_setzero_si256();
#else
            __m128i _sum00 = _mm_setzero_si128();
            __m128i _sum10 = _mm_setzero_si128();
#endif

            if (nn4 > 0)
            {
#if __AVX2__
#if __AVXVNNI__ || __AVX512VNNI__
                __m256i _sum10_02 = _mm256_setzero_si256();
#else
                __m256i _sum10_02 = _mm256_setzero_si256();
                __m256i _sum01_13 = _mm256_setzero_si256();
                __m256i _sum11_03 = _mm256_setzero_si256();
#endif
#else
#if __XOP__
                __m128i _sum01 = _mm_setzero_si128();
                __m128i _sum11 = _mm_setzero_si128();
#else
                __m128i _sum01 = _mm_setzero_si128();
                __m128i _sum02 = _mm_setzero_si128();
                __m128i _sum03 = _mm_setzero_si128();
                __m128i _sum11 = _mm_setzero_si128();
                __m128i _sum12 = _mm_setzero_si128();
                __m128i _sum13 = _mm_setzero_si128();
#endif
#endif

                int j = 0;
                for (; j < nn4; j++)
                {
#if __AVX2__
                    __m128i _val01 = _mm_loadu_si128((const __m128i*)tmpptr);
                    __m256i _val01_16 = _mm256_cvtepi8_epi16(_val01);

                    _val01_16 = _mm256_permute4x64_epi64(_val01_16, _MM_SHUFFLE(1, 1, 0, 0));

                    __m128i _w01 = _mm_loadu_si128((const __m128i*)kptr0);
                    __m256i _w01_16 = _mm256_cvtepi8_epi16(_w01);

                    __m256i _val10_16 = _mm256_permute4x64_epi64(_val01_16, 78);

#if __AVXVNNI__ || __AVX512VNNI__
                    _sum00_12 = _mm256_dpwssd_epi32(_sum00_12, _val01_16, _w01_16);
                    _sum10_02 = _mm256_dpwssd_epi32(_sum10_02, _val10_16, _w01_16);
#else
                    __m256i _sl00_11 = _mm256_mullo_epi16(_val01_16, _w01_16);
                    __m256i _sh00_11 = _mm256_mulhi_epi16(_val01_16, _w01_16);
                    __m256i _sl10_01 = _mm256_mullo_epi16(_val10_16, _w01_16);
                    __m256i _sh10_01 = _mm256_mulhi_epi16(_val10_16, _w01_16);

                    _sum00_12 = _mm256_add_epi32(_sum00_12, _mm256_unpacklo_epi16(_sl00_11, _sh00_11));
                    _sum10_02 = _mm256_add_epi32(_sum10_02, _mm256_unpacklo_epi16(_sl10_01, _sh10_01));
                    _sum01_13 = _mm256_add_epi32(_sum01_13, _mm256_unpackhi_epi16(_sl00_11, _sh00_11));
                    _sum11_03 = _mm256_add_epi32(_sum11_03, _mm256_unpackhi_epi16(_sl10_01, _sh10_01));
#endif
#else
                    __m128i _val01 = _mm_loadl_epi64((const __m128i*)tmpptr);
#if __SSE4_1__
                    _val01 = _mm_cvtepi8_epi16(_val01);
#else
                    __m128i _extval01 = _mm_cmpgt_epi8(_mm_setzero_si128(), _val01);
                    _val01 = _mm_unpacklo_epi8(_val01, _extval01);
#endif

                    __m128i _val0 = _mm_shuffle_epi32(_val01, _MM_SHUFFLE(1, 0, 1, 0));
                    __m128i _val1 = _mm_shuffle_epi32(_val01, _MM_SHUFFLE(3, 2, 3, 2));

                    __m128i _w01 = _mm_loadu_si128((const __m128i*)kptr0);
                    __m128i _extw01 = _mm_cmpgt_epi8(_mm_setzero_si128(), _w01);
                    __m128i _w0 = _mm_unpacklo_epi8(_w01, _extw01);
                    __m128i _w1 = _mm_unpackhi_epi8(_w01, _extw01);

#if __XOP__
                    _sum00 = _mm_maddd_epi16(_val0, _w0, _sum00);
                    _sum01 = _mm_maddd_epi16(_val0, _w1, _sum01);
                    _sum10 = _mm_maddd_epi16(_val1, _w0, _sum10);
                    _sum11 = _mm_maddd_epi16(_val1, _w1, _sum11);
#else
                    __m128i _sl00 = _mm_mullo_epi16(_val0, _w0);
                    __m128i _sh00 = _mm_mulhi_epi16(_val0, _w0);
                    __m128i _sl01 = _mm_mullo_epi16(_val0, _w1);
                    __m128i _sh01 = _mm_mulhi_epi16(_val0, _w1);
                    __m128i _sl10 = _mm_mullo_epi16(_val1, _w0);
                    __m128i _sh10 = _mm_mulhi_epi16(_val1, _w0);
                    __m128i _sl11 = _mm_mullo_epi16(_val1, _w1);
                    __m128i _sh11 = _mm_mulhi_epi16(_val1, _w1);

                    _sum00 = _mm_add_epi32(_sum00, _mm_unpacklo_epi16(_sl00, _sh00));
                    _sum01 = _mm_add_epi32(_sum01, _mm_unpackhi_epi16(_sl00, _sh00));
                    _sum02 = _mm_add_epi32(_sum02, _mm_unpacklo_epi16(_sl01, _sh01));
                    _sum03 = _mm_add_epi32(_sum03, _mm_unpackhi_epi16(_sl01, _sh01));
                    _sum10 = _mm_add_epi32(_sum10, _mm_unpacklo_epi16(_sl10, _sh10));
                    _sum11 = _mm_add_epi32(_sum11, _mm_unpackhi_epi16(_sl10, _sh10));
                    _sum12 = _mm_add_epi32(_sum12, _mm_unpacklo_epi16(_sl11, _sh11));
                    _sum13 = _mm_add_epi32(_sum13, _mm_unpackhi_epi16(_sl11, _sh11));
#endif
#endif

                    tmpptr += 8;
                    kptr0 += 16;
                }

#if __AVX2__
#if __AVXVNNI__ || __AVX512VNNI__
                _sum00_12 = _mm256_hadd_epi32(_sum00_12, _sum10_02);

                _sum00_12 = _mm256_permute4x64_epi64(_sum00_12, _MM_SHUFFLE(2, 1, 3, 0));
#else
                // transpose 4x8
                {
                    __m256i _tmp0, _tmp1, _tmp2, _tmp3;
                    _tmp0 = _mm256_unpacklo_epi32(_sum00_12, _sum10_02);
                    _tmp1 = _mm256_unpacklo_epi32(_sum01_13, _sum11_03);
                    _tmp2 = _mm256_unpackhi_epi32(_sum00_12, _sum10_02);
                    _tmp3 = _mm256_unpackhi_epi32(_sum01_13, _sum11_03);
                    _sum00_12 = _mm256_unpacklo_epi64(_tmp0, _tmp1);
                    _sum10_02 = _mm256_unpackhi_epi64(_tmp0, _tmp1);
                    _sum01_13 = _mm256_unpacklo_epi64(_tmp2, _tmp3);
                    _sum11_03 = _mm256_unpackhi_epi64(_tmp2, _tmp3);
                }

                _sum00_12 = _mm256_add_epi32(_sum00_12, _sum10_02);
                _sum01_13 = _mm256_add_epi32(_sum01_13, _sum11_03);
                _sum00_12 = _mm256_add_epi32(_sum00_12, _sum01_13);

                __m256i _perm_mask = _mm256_set_epi32(6, 4, 3, 1, 7, 5, 2, 0);
                _sum00_12 = _mm256_permutevar8x32_epi32(_sum00_12, _perm_mask);
#endif
#else
#if __XOP__
                _sum00 = _mm_hadd_epi32(_sum00, _sum01);
                _sum10 = _mm_hadd_epi32(_sum10, _sum11);
#else
                // transpose 4x4
                {
                    __m128i _tmp0, _tmp1, _tmp2, _tmp3;
                    _tmp0 = _mm_unpacklo_epi32(_sum00, _sum01);
                    _tmp1 = _mm_unpacklo_epi32(_sum02, _sum03);
                    _tmp2 = _mm_unpackhi_epi32(_sum00, _sum01);
                    _tmp3 = _mm_unpackhi_epi32(_sum02, _sum03);
                    _sum00 = _mm_unpacklo_epi64(_tmp0, _tmp1);
                    _sum01 = _mm_unpackhi_epi64(_tmp0, _tmp1);
                    _sum02 = _mm_unpacklo_epi64(_tmp2, _tmp3);
                    _sum03 = _mm_unpackhi_epi64(_tmp2, _tmp3);
                }
                {
                    __m128i _tmp0, _tmp1, _tmp2, _tmp3;
                    _tmp0 = _mm_unpacklo_epi32(_sum10, _sum11);
                    _tmp1 = _mm_unpacklo_epi32(_sum12, _sum13);
                    _tmp2 = _mm_unpackhi_epi32(_sum10, _sum11);
                    _tmp3 = _mm_unpackhi_epi32(_sum12, _sum13);
                    _sum10 = _mm_unpacklo_epi64(_tmp0, _tmp1);
                    _sum11 = _mm_unpackhi_epi64(_tmp0, _tmp1);
                    _sum12 = _mm_unpacklo_epi64(_tmp2, _tmp3);
                    _sum13 = _mm_unpackhi_epi64(_tmp2, _tmp3);
                }

                _sum00 = _mm_add_epi32(_sum00, _sum01);
                _sum02 = _mm_add_epi32(_sum02, _sum03);
                _sum10 = _mm_add_epi32(_sum10, _sum11);
                _sum12 = _mm_add_epi32(_sum12, _sum13);

                _sum00 = _mm_add_epi32(_sum00, _sum02);
                _sum10 = _mm_add_epi32(_sum10, _sum12);
#endif
#endif
            }

#if __AVX2__
            __m128i _sum00 = _mm256_extracti128_si256(_sum00_12, 0);
            __m128i _sum10 = _mm256_extracti128_si256(_sum00_12, 1);
#endif

            int j = 0;
            for (; j < nn1; j++)
            {
                __m128i _val = _mm_set_epi16(tmpptr[1], tmpptr[1], tmpptr[1], tmpptr[1], tmpptr[0], tmpptr[0], tmpptr[0], tmpptr[0]);

                __m128i _w0123 = _mm_loadl_epi64((const __m128i*)kptr0);
#if __SSE4_1__
                _w0123 = _mm_cvtepi8_epi16(_w0123);
#else
                __m128i _extw0123 = _mm_cmpgt_epi8(_mm_setzero_si128(), _w0123);
                _w0123 = _mm_unpacklo_epi8(_w0123, _extw0123);
#endif

                _w0123 = _mm_shuffle_epi32(_w0123, _MM_SHUFFLE(1, 0, 1, 0));

                __m128i _sl00 = _mm_mullo_epi16(_val, _w0123);
                __m128i _sh00 = _mm_mulhi_epi16(_val, _w0123);

                _sum00 = _mm_add_epi32(_sum00, _mm_unpacklo_epi16(_sl00, _sh00));
                _sum10 = _mm_add_epi32(_sum10, _mm_unpackhi_epi16(_sl00, _sh00));

                tmpptr += 2;
                kptr0 += 4;
            }

            _mm_storeu_si128((__m128i*)outptr0, _sum00);
            _mm_storeu_si128((__m128i*)(outptr0 + 4), _sum10);
            outptr0 += 8;
        }
        for (; i < size; i++)
        {
#if __AVX2__
            const signed char* tmpptr = tmp.channel(i / 4 + (i % 4) / 2 + i % 2);
#else
            const signed char* tmpptr = tmp.channel(i / 2 + i % 2);
#endif
            const signed char* kptr0 = kernel.channel(p);

            int nn4 = (inch / 4) * maxk;
            int nn1 = (inch % 4) * maxk;

            __m128i _sum0 = _mm_setzero_si128();

            if (nn4 > 0)
            {
                __m128i _sum1 = _mm_setzero_si128();
                __m128i _sum2 = _mm_setzero_si128();
                __m128i _sum3 = _mm_setzero_si128();

                int j = 0;
                for (; j < nn4; j++)
                {
                    __m128i _val01 = _mm_loadl_epi64((const __m128i*)tmpptr);
#if __SSE4_1__
                    __m128i _val0 = _mm_cvtepi8_epi16(_val01);
#else
                    __m128i _extval01 = _mm_cmpgt_epi8(_mm_setzero_si128(), _val01);
                    __m128i _val0 = _mm_unpacklo_epi8(_val01, _extval01);
#endif

                    _val0 = _mm_shuffle_epi32(_val0, _MM_SHUFFLE(1, 0, 1, 0));

                    __m128i _w01 = _mm_loadu_si128((const __m128i*)kptr0);
                    __m128i _extw01 = _mm_cmpgt_epi8(_mm_setzero_si128(), _w01);
                    __m128i _w0 = _mm_unpacklo_epi8(_w01, _extw01);
                    __m128i _w1 = _mm_unpackhi_epi8(_w01, _extw01);

                    __m128i _sl00 = _mm_mullo_epi16(_val0, _w0);
                    __m128i _sh00 = _mm_mulhi_epi16(_val0, _w0);
                    __m128i _sl01 = _mm_mullo_epi16(_val0, _w1);
                    __m128i _sh01 = _mm_mulhi_epi16(_val0, _w1);

                    _sum0 = _mm_add_epi32(_sum0, _mm_unpacklo_epi16(_sl00, _sh00));
                    _sum1 = _mm_add_epi32(_sum1, _mm_unpackhi_epi16(_sl00, _sh00));
                    _sum2 = _mm_add_epi32(_sum2, _mm_unpacklo_epi16(_sl01, _sh01));
                    _sum3 = _mm_add_epi32(_sum3, _mm_unpackhi_epi16(_sl01, _sh01));

                    tmpptr += 4;
                    kptr0 += 16;
                }

                // transpose 4x4
                {
                    __m128i _tmp0, _tmp1, _tmp2, _tmp3;
                    _tmp0 = _mm_unpacklo_epi32(_sum0, _sum1);
                    _tmp1 = _mm_unpacklo_epi32(_sum2, _sum3);
                    _tmp2 = _mm_unpackhi_epi32(_sum0, _sum1);
                    _tmp3 = _mm_unpackhi_epi32(_sum2, _sum3);
                    _sum0 = _mm_unpacklo_epi64(_tmp0, _tmp1);
                    _sum1 = _mm_unpackhi_epi64(_tmp0, _tmp1);
                    _sum2 = _mm_unpacklo_epi64(_tmp2, _tmp3);
                    _sum3 = _mm_unpackhi_epi64(_tmp2, _tmp3);
                }

                _sum0 = _mm_add_epi32(_sum0, _sum1);
                _sum2 = _mm_add_epi32(_sum2, _sum3);
                _sum0 = _mm_add_epi32(_sum0, _sum2);
            }

            int j = 0;
            for (; j < nn1; j++)
            {
                __m128i _val = _mm_set1_epi16(tmpptr[0]);

                __m128i _w0123 = _mm_loadl_epi64((const __m128i*)kptr0);
#if __SSE4_1__
                _w0123 = _mm_cvtepi8_epi16(_w0123);
#else
                __m128i _extw0123 = _mm_cmpgt_epi8(_mm_setzero_si128(), _w0123);
                _w0123 = _mm_unpacklo_epi8(_w0123, _extw0123);
#endif

                __m128i _sl00 = _mm_mullo_epi16(_val, _w0123);
                __m128i _sh00 = _mm_mulhi_epi16(_val, _w0123);

                _sum0 = _mm_add_epi32(_sum0, _mm_unpacklo_epi16(_sl00, _sh00));

                tmpptr += 1;
                kptr0 += 4;
            }

            _mm_storeu_si128((__m128i*)outptr0, _sum0);
            outptr0 += 4;
        }
    }
}